

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::GetLabelAt
          (BinaryReaderIR *this,LabelNode **label,Index depth)

{
  pointer pLVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = (ulong)depth;
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->label_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1;
  uVar2 = lVar3 / 0x18;
  if (uVar4 < uVar2) {
    *label = (LabelNode *)((long)pLVar1 + ~uVar4 * 0x18 + lVar3);
    return (Result)Ok;
  }
  PrintError(this,"accessing stack depth: %u >= max: %zd",depth,uVar2,lVar3,uVar4,uVar2);
  return (Result)Error;
}

Assistant:

Result BinaryReaderIR::GetLabelAt(LabelNode** label, Index depth) {
  if (depth >= label_stack_.size()) {
    PrintError("accessing stack depth: %" PRIindex " >= max: %" PRIzd, depth,
               label_stack_.size());
    return Result::Error;
  }

  *label = &label_stack_[label_stack_.size() - depth - 1];
  return Result::Ok;
}